

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfdata.cpp
# Opt level: O1

int __thiscall PFData::emplaceSubgridFromFile(PFData *this,FILE *fp,int gridZ,int gridY,int gridX)

{
  int iVar1;
  double *pdVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  size_t sVar8;
  double dVar9;
  int *piVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  int size_2;
  int iVar17;
  int start_1;
  int iVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  size_t __n;
  int local_58;
  
  lVar7 = getSubgridOffsetElements(this,gridZ,gridY,gridX);
  fseek((FILE *)fp,
        (long)(((this->m_q * gridZ + gridY) * this->m_p + gridX) * 0x24) + lVar7 * 8 + 100,0);
  iVar12 = this->m_r;
  iVar13 = this->m_ny;
  iVar6 = this->m_nz / iVar12;
  iVar15 = (uint)(gridZ < this->m_nz % iVar12) + iVar6;
  iVar18 = this->m_p;
  iVar16 = iVar13 / iVar18;
  iVar11 = iVar13 % this->m_q;
  iVar19 = gridY;
  if (iVar11 < gridY) {
    iVar19 = iVar11;
  }
  iVar4 = -(iVar11 - gridY) * iVar16;
  if (gridY < iVar11) {
    iVar4 = 0;
  }
  iVar1 = this->m_nx;
  iVar17 = iVar1 / iVar18;
  iVar18 = iVar1 % iVar18;
  iVar12 = iVar1 % iVar12;
  iVar23 = gridZ;
  if (iVar12 < gridZ) {
    iVar23 = iVar12;
  }
  iVar5 = -(iVar12 - gridZ) * iVar6;
  if (gridZ < iVar12) {
    iVar5 = 0;
  }
  iVar12 = gridX;
  if (iVar18 < gridX) {
    iVar12 = iVar18;
  }
  iVar20 = -(iVar18 - gridX) * iVar17;
  if (gridX < iVar18) {
    iVar20 = 0;
  }
  if (0 < iVar15) {
    iVar11 = (uint)(gridY < iVar11) + iVar16;
    iVar19 = iVar19 * (iVar16 + 1);
    iVar20 = iVar20 + iVar12 * (iVar17 + 1);
    iVar13 = (iVar5 + iVar23 * (iVar6 + 1)) * iVar13;
    iVar17 = (uint)(gridX < iVar18) + iVar17;
    __n = (size_t)iVar17;
    lVar7 = (long)((iVar13 + iVar4 + iVar19) * iVar1 + iVar20);
    iVar12 = 0;
    do {
      bVar3 = 0 < iVar11;
      if (0 < iVar11) {
        iVar18 = 0;
        do {
          lVar21 = (long)(this->m_nx * iVar12 * this->m_ny);
          lVar14 = (long)(this->m_nx * iVar18);
          pdVar2 = this->m_data;
          sVar8 = fread(pdVar2 + (long)((iVar19 + iVar4 + iVar13) * iVar1 + iVar20) +
                                 lVar21 + lVar14,8,__n,(FILE *)fp);
          if (sVar8 == __n) {
            if (iVar17 != 0) {
              lVar22 = 0;
              do {
                dVar9 = (double)bswap64((uint64_t)pdVar2[lVar7 + lVar21 + lVar14 + lVar22]);
                pdVar2[lVar7 + lVar21 + lVar14 + lVar22] = dVar9;
                lVar22 = lVar22 + 1;
              } while (__n + (__n == 0) != lVar22);
            }
          }
          else {
            piVar10 = __errno_location();
            local_58 = *piVar10;
          }
          if (sVar8 != __n) break;
          iVar18 = iVar18 + 1;
          bVar3 = iVar18 < iVar11;
        } while (iVar18 != iVar11);
      }
      if (bVar3) {
        return local_58;
      }
      iVar12 = iVar12 + 1;
    } while (iVar12 != iVar15);
  }
  return 0;
}

Assistant:

int PFData::emplaceSubgridFromFile(std::FILE* fp, int gridZ, int gridY, int gridX){
    //Position file
    const long offset = getSubgridOffset(gridZ, gridY, gridX) + 36;
    std::fseek(fp, offset, SEEK_SET);

    const int sizeZ = getSubgridSizeZ(gridZ);
    const int sizeY = getSubgridSizeY(gridY);
    const int sizeX = getSubgridSizeX(gridX);

    const int startZ = getSubgridStartZ(gridZ);
    const int startY = getSubgridStartY(gridY);
    const int startX = getSubgridStartX(gridX);

    //The index into m_data where the first element of the grid belongs.
    const long long startOfGrid = startZ*m_nx*m_ny + startY * m_nx + startX;

    for(int z = 0; z < sizeZ; ++z){
        for(int y = 0; y < sizeY; ++y){
            const long long index = startOfGrid + z * m_nx * m_ny + y * m_nx;
            double* const dataPtr = &(m_data[index]);

            const std::size_t numRead = std::fread(dataPtr, 8, sizeX, fp);
            if(numRead != static_cast<std::size_t>(sizeX)){
                return errno;
            }

            //Perform endian byte swap
            for(std::size_t i = 0; i < sizeX; ++i){
                uint64_t tmp = *reinterpret_cast<uint64_t*>(&dataPtr[i]);
                tmp = bswap64(tmp);
                dataPtr[i] = *reinterpret_cast<double*>(&tmp);
            }
        }
    }

    return 0;
}